

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericDescriptor::Dump(GenericDescriptor *this,FILE *stream)

{
  char identbuf [128];
  FILE *stream_local;
  GenericDescriptor *this_local;
  
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  fprintf((FILE *)identbuf._120_8_,"  %22s:\n","Locators");
  FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
            (&(this->Locators).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>,
             (FILE *)identbuf._120_8_,0);
  fprintf((FILE *)identbuf._120_8_,"  %22s:\n","SubDescriptors");
  FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
            (&(this->SubDescriptors).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>,
             (FILE *)identbuf._120_8_,0);
  return;
}

Assistant:

void
GenericDescriptor::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s:\n",  "Locators");
  Locators.Dump(stream);
  fprintf(stream, "  %22s:\n",  "SubDescriptors");
  SubDescriptors.Dump(stream);
}